

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l5_ur.c
# Opt level: O0

int picnic_l5_ur_write_public_key(picnic_l5_ur_publickey_t *key,uint8_t *buf,size_t buflen)

{
  ulong in_RDX;
  undefined1 *in_RSI;
  void *in_RDI;
  int local_4;
  
  if ((in_RDI == (void *)0x0) || (in_RSI == (undefined1 *)0x0)) {
    local_4 = -1;
  }
  else if (in_RDX < 0x41) {
    local_4 = -1;
  }
  else {
    *in_RSI = 6;
    memcpy(in_RSI + 1,in_RDI,0x40);
    local_4 = 0x41;
  }
  return local_4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l5_ur_write_public_key(const picnic_l5_ur_publickey_t* key,
                                                            uint8_t* buf, size_t buflen) {
  if (!key || !buf) {
    return -1;
  }

  if (buflen < PUBLIC_KEY_SIZE) {
    return -1;
  }

  buf[0] = PARAM;
  memcpy(buf + 1, key->data, PUBLIC_KEY_SIZE - 1);
  return PUBLIC_KEY_SIZE;
}